

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementCableANCF.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChElementCableANCF::ComputeInternalForces
          (ChElementCableANCF *this,ChVectorDynamic<> *Fi)

{
  pointer psVar1;
  element_type *peVar2;
  element_type *peVar3;
  
  psVar1 = (this->nodes).
           super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  peVar2 = (psVar1->super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  peVar3 = psVar1[1].super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  ComputeInternalForces_Impl
            (this,(ChVector<double> *)((long)&peVar2->super_ChNodeFEAxyz + 0x20),
             (ChVector<double> *)((long)&peVar2->super_ChNodeFEAxyz + 0xf0),
             (ChVector<double> *)((long)&peVar3->super_ChNodeFEAxyz + 0x20),
             (ChVector<double> *)((long)&peVar3->super_ChNodeFEAxyz + 0xf0),
             (ChVector<double> *)((long)&peVar2->super_ChNodeFEAxyz + 0x38),&peVar2->D_dt,
             (ChVector<double> *)((long)&peVar3->super_ChNodeFEAxyz + 0x38),&peVar3->D_dt,Fi);
  return;
}

Assistant:

void ChElementCableANCF::ComputeInternalForces(ChVectorDynamic<>& Fi) {
    ComputeInternalForces_Impl(this->nodes[0]->GetPos(), this->nodes[0]->GetD(), this->nodes[1]->GetPos(),
                               this->nodes[1]->GetD(), this->nodes[0]->GetPos_dt(), this->nodes[0]->GetD_dt(),
                               this->nodes[1]->GetPos_dt(), this->nodes[1]->GetD_dt(), Fi);
}